

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_check_wildcard(char *cn,mbedtls_x509_buf *name)

{
  int iVar1;
  size_t sVar2;
  size_t cn_len;
  size_t cn_idx;
  size_t i;
  mbedtls_x509_buf *name_local;
  char *cn_local;
  
  cn_len = 0;
  sVar2 = strlen(cn);
  if (((name->len < 3) || (*name->p != '*')) || (name->p[1] != '.')) {
    cn_local._4_4_ = 0;
  }
  else {
    for (cn_idx = 0; cn_idx < sVar2; cn_idx = cn_idx + 1) {
      if (cn[cn_idx] == '.') {
        cn_len = cn_idx;
        break;
      }
    }
    if (cn_len == 0) {
      cn_local._4_4_ = -1;
    }
    else {
      if ((sVar2 - cn_len == name->len - 1) &&
         (iVar1 = x509_memcasecmp(name->p + 1,cn + cn_len,name->len - 1), iVar1 == 0)) {
        return 0;
      }
      cn_local._4_4_ = -1;
    }
  }
  return cn_local._4_4_;
}

Assistant:

static int x509_check_wildcard( const char *cn, mbedtls_x509_buf *name )
{
    size_t i;
    size_t cn_idx = 0, cn_len = strlen( cn );

    if( name->len < 3 || name->p[0] != '*' || name->p[1] != '.' )
        return( 0 );

    for( i = 0; i < cn_len; ++i )
    {
        if( cn[i] == '.' )
        {
            cn_idx = i;
            break;
        }
    }

    if( cn_idx == 0 )
        return( -1 );

    if( cn_len - cn_idx == name->len - 1 &&
        x509_memcasecmp( name->p + 1, cn + cn_idx, name->len - 1 ) == 0 )
    {
        return( 0 );
    }

    return( -1 );
}